

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  float *pfVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  byte bVar17;
  uchar rgbe [4];
  uchar scanlineheader [4];
  char header [66];
  char buffer [128];
  undefined1 local_1b2;
  char local_1b1;
  uchar local_1b0;
  undefined1 local_1af;
  undefined1 local_1ae;
  undefined1 local_1ad;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  undefined4 local_1a0;
  uint local_19c;
  ulong local_198;
  uint local_190;
  uint local_18c;
  int local_188;
  uint local_184;
  long local_180;
  void *local_178;
  long local_170;
  ulong local_168;
  void *local_160;
  long local_158;
  float *local_150;
  ulong local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  void *local_120;
  long local_118;
  long local_110;
  undefined8 local_108 [8];
  undefined2 local_c8;
  char local_b8 [136];
  
  bVar17 = 0;
  iVar2 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    local_150 = data;
    pvVar4 = malloc((ulong)(uint)(x * 4));
    pcVar11 = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
    puVar13 = local_108;
    for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar13 = *(undefined8 *)pcVar11;
      pcVar11 = pcVar11 + ((ulong)bVar17 * -2 + 1) * 8;
      puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
    }
    local_c8 = 10;
    (*s->func)(s->context,local_108,0x41);
    iVar2 = sprintf(local_b8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    uVar8 = 0;
    (*s->func)(s->context,local_b8,iVar2);
    local_188 = comp * x;
    local_18c = (uint)x >> 8;
    local_190 = x - 0x8000;
    local_19c = comp - 3;
    uVar12 = (ulong)(uint)x;
    local_170 = uVar12 - 3;
    local_180 = (long)comp << 2;
    local_138 = -uVar12;
    local_130 = (ulong)(uint)(x * 3) + (long)pvVar4;
    local_128 = (ulong)(uint)(x * 2) + (long)pvVar4;
    local_140 = (long)pvVar4 + uVar12;
    local_158 = (long)pvVar4 + 2;
    local_198 = (ulong)(uint)x;
    local_184 = y;
    local_168 = uVar12;
    local_120 = pvVar4;
    do {
      uVar7 = local_19c;
      uVar3 = ~(uint)uVar8 + local_184;
      if (stbi__flip_vertically_on_write == 0) {
        uVar3 = (uint)uVar8;
      }
      pfVar9 = local_150 + (int)(uVar3 * local_188);
      local_1a0 = CONCAT13((char)local_198,CONCAT12((char)local_18c,0x202));
      uVar14 = uVar12;
      local_148 = uVar8;
      if (local_190 < 0xffff8008) {
        do {
          if (local_19c < 2) {
            local_1a4 = pfVar9[2];
            local_1a8 = pfVar9[1];
            local_1ac = *pfVar9;
          }
          else {
            local_1ac = *pfVar9;
            local_1a8 = local_1ac;
            local_1a4 = local_1ac;
          }
          stbiw__linear_to_rgbe(&local_1b0,&local_1ac);
          (*s->func)(s->context,&local_1b0,4);
          pfVar9 = (float *)((long)pfVar9 + local_180);
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      else {
        lVar6 = 0;
        do {
          if (uVar7 < 2) {
            local_1a4 = pfVar9[2];
            local_1a8 = pfVar9[1];
            local_1ac = *pfVar9;
          }
          else {
            local_1ac = *pfVar9;
            local_1a8 = local_1ac;
            local_1a4 = local_1ac;
          }
          stbiw__linear_to_rgbe(&local_1b0,&local_1ac);
          *(uchar *)((long)pvVar4 + lVar6) = local_1b0;
          *(undefined1 *)(local_140 + lVar6) = local_1af;
          *(undefined1 *)(local_128 + lVar6) = local_1ae;
          *(undefined1 *)(local_130 + lVar6) = local_1ad;
          lVar6 = lVar6 + 1;
          pfVar9 = (float *)((long)pfVar9 + local_180);
        } while (local_138 + lVar6 != 0);
        (*s->func)(s->context,&local_1a0,4);
        lVar5 = 0;
        lVar6 = local_158;
        local_178 = pvVar4;
        do {
          pvVar4 = (void *)(lVar5 * uVar12 + (long)pvVar4);
          iVar2 = 0;
          local_160 = pvVar4;
          local_118 = lVar5;
          local_110 = lVar6;
          do {
            iVar10 = (int)local_198;
            iVar16 = iVar10;
            if (iVar2 + 2 < iVar10) {
              lVar6 = (long)iVar2 + -1;
              iVar15 = iVar2;
              do {
                cVar1 = *(char *)(local_110 + -1 + lVar6);
                if ((cVar1 == *(char *)(local_110 + lVar6)) &&
                   (iVar16 = iVar15, cVar1 == *(char *)(local_110 + 1 + lVar6))) break;
                iVar15 = iVar15 + 1;
                lVar6 = lVar6 + 1;
                iVar16 = iVar10;
              } while (lVar6 < local_170);
            }
            for (; iVar2 < iVar16; iVar2 = iVar2 + iVar10) {
              iVar10 = iVar16 - iVar2;
              if (0x7f < iVar10) {
                iVar10 = 0x80;
              }
              local_1b2 = (undefined1)iVar10;
              (*s->func)(s->context,&local_1b2,1);
              (*s->func)(s->context,(void *)((long)pvVar4 + (long)iVar2),iVar10);
              pvVar4 = local_160;
            }
            iVar10 = (int)local_198;
            if (iVar16 + 2 < iVar10) {
              lVar6 = (long)iVar16;
              iVar15 = iVar16 + 1;
              if (iVar16 + 1 < iVar10) {
                iVar15 = iVar10;
              }
              do {
                if (*(char *)((long)local_178 + lVar6) != *(char *)((long)pvVar4 + (long)iVar2)) {
                  iVar15 = (int)lVar6;
                  break;
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < (long)local_168);
              if (iVar2 < iVar15) {
                do {
                  iVar16 = iVar15 - iVar2;
                  if (0x7e < iVar15 - iVar2) {
                    iVar16 = 0x7f;
                  }
                  local_1b2 = *(undefined1 *)((long)pvVar4 + (long)iVar2);
                  local_1b1 = (char)iVar16 + -0x80;
                  (*s->func)(s->context,&local_1b1,1);
                  (*s->func)(s->context,&local_1b2,1);
                  iVar2 = iVar2 + iVar16;
                  pvVar4 = local_160;
                } while (iVar2 < iVar15);
              }
            }
          } while (iVar2 < (int)local_198);
          lVar5 = local_118 + 1;
          lVar6 = local_110 + local_168;
          local_178 = (void *)((long)local_178 + local_168);
          uVar12 = local_168;
          pvVar4 = local_120;
        } while (lVar5 != 4);
      }
      uVar7 = (int)local_148 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != local_184);
    free(pvVar4);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef __STDC_LIB_EXT1__
      len = sprintf_s(buffer, sizeof(buffer), "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i));
      STBIW_FREE(scratch);
      return 1;
   }
}